

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

rf_vec2 rf_get_world_to_screen(rf_sizei screen_size,rf_vec3 position,rf_camera3d camera)

{
  rf_mat mat;
  rf_mat mat_00;
  rf_vec2 rVar1;
  double top_00;
  double right_00;
  rf_quaternion rVar2;
  rf_vec3 ndc_pos;
  float fStack_198;
  float fStack_194;
  rf_quaternion world_pos;
  undefined1 auStack_150 [8];
  rf_mat mat_view;
  double right;
  double top;
  float aspect;
  undefined8 uStack_78;
  rf_mat mat_proj;
  rf_vec3 position_local;
  rf_sizei screen_size_local;
  rf_vec2 screen_position;
  
  register0x00001200 = position._0_8_;
  rf_mat_identity();
  position_local.y = (float)screen_size.width;
  position_local.z = (float)screen_size.height;
  if (camera.type == RF_CAMERA_PERSPECTIVE) {
    rf_mat_perspective((rf_mat *)&stack0xffffffffffffff48,(double)(camera.fovy * 0.017453292),
                       (double)(int)position_local.y / (double)(int)position_local.z,0.01,1000.0);
    memcpy(&uStack_78,&stack0xffffffffffffff48,0x40);
  }
  else if (camera.type == RF_CAMERA_ORTHOGRAPHIC) {
    top_00 = (double)camera.fovy / 2.0;
    right_00 = top_00 * (double)((float)(int)position_local.y / (float)(int)position_local.z);
    rf_mat_ortho((rf_mat *)&mat_view.m11,-right_00,right_00,-top_00,top_00,0.01,1000.0);
    memcpy(&uStack_78,&mat_view.m11,0x40);
  }
  rf_mat_look_at((rf_mat *)auStack_150,camera.position,camera.target,camera.up);
  rVar2.w = 1.0;
  rVar2._0_12_ = position;
  mat.m8 = mat_view.m0;
  mat.m12 = mat_view.m4;
  mat.m0 = (float)auStack_150._0_4_;
  mat.m4 = (float)auStack_150._4_4_;
  mat.m1 = mat_view.m8;
  mat.m5 = mat_view.m12;
  mat.m9 = mat_view.m1;
  mat.m13 = mat_view.m5;
  mat.m2 = mat_view.m9;
  mat.m6 = mat_view.m13;
  mat.m10 = mat_view.m2;
  mat.m14 = mat_view.m6;
  mat.m3 = mat_view.m10;
  mat.m7 = mat_view.m14;
  mat.m11 = mat_view.m3;
  mat.m15 = mat_view.m7;
  rVar2 = rf_quaternion_transform(rVar2,mat);
  mat_00.m8 = mat_proj.m0;
  mat_00.m12 = mat_proj.m4;
  mat_00.m0 = (float)(undefined4)uStack_78;
  mat_00.m4 = (float)uStack_78._4_4_;
  mat_00.m1 = mat_proj.m8;
  mat_00.m5 = mat_proj.m12;
  mat_00.m9 = mat_proj.m1;
  mat_00.m13 = mat_proj.m5;
  mat_00.m2 = mat_proj.m9;
  mat_00.m6 = mat_proj.m13;
  mat_00.m10 = mat_proj.m2;
  mat_00.m14 = mat_proj.m6;
  mat_00.m3 = mat_proj.m10;
  mat_00.m7 = mat_proj.m14;
  mat_00.m11 = mat_proj.m3;
  mat_00.m15 = mat_proj.m7;
  rVar2 = rf_quaternion_transform(rVar2,mat_00);
  fStack_198 = rVar2.x;
  fStack_194 = rVar2.y;
  world_pos.y = rVar2.w;
  rVar1.y = (-fStack_194 / world_pos.y + 1.0) * 0.5 * (float)(int)position_local.z;
  rVar1.x = (fStack_198 / world_pos.y + 1.0) * 0.5 * (float)(int)position_local.y;
  return rVar1;
}

Assistant:

RF_API rf_vec2 rf_get_world_to_screen(rf_sizei screen_size, rf_vec3 position, rf_camera3d camera)
{
    // Calculate projection matrix from perspective instead of frustum
    rf_mat mat_proj = rf_mat_identity();

    if (camera.type == RF_CAMERA_PERSPECTIVE)
    {
        // Calculate projection matrix from perspective
        mat_proj = rf_mat_perspective(camera.fovy * RF_DEG2RAD, ((double) screen_size.width / (double) screen_size.height), 0.01, 1000.0);
    }
    else if (camera.type == RF_CAMERA_ORTHOGRAPHIC)
    {
        float aspect = (float) screen_size.width / (float) screen_size.height;
        double top = camera.fovy / 2.0;
        double right = top * aspect;

    // Calculate projection matrix from orthographic
        mat_proj = rf_mat_ortho(-right, right, -top, top, 0.01, 1000.0);
    }

    // Calculate view matrix from camera look at (and transpose it)
    rf_mat mat_view = rf_mat_look_at(camera.position, camera.target, camera.up);

    // Convert world position vector to quaternion
    rf_quaternion world_pos = { position.x, position.y, position.z, 1.0f };

    // Transform world position to view
    world_pos = rf_quaternion_transform(world_pos, mat_view);

    // Transform result to projection (clip space position)
    world_pos = rf_quaternion_transform(world_pos, mat_proj);

    // Calculate normalized device coordinates (inverted y)
    rf_vec3 ndc_pos = {world_pos.x / world_pos.w, -world_pos.y / world_pos.w, world_pos.z / world_pos.w};

    // Calculate 2d screen position vector
    rf_vec2 screen_position = {(ndc_pos.x + 1.0f) / 2.0f * (float) screen_size.width,
                               (ndc_pos.y + 1.0f) / 2.0f * (float) screen_size.height};

    return screen_position;
}